

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_signature.c
# Opt level: O0

value signature_metadata_return(signature s)

{
  value *ppvVar1;
  value pvVar2;
  value *ret_map;
  value *ret_array;
  value ret;
  value in_stack_00000050;
  size_t in_stack_ffffffffffffffd8;
  value *in_stack_ffffffffffffffe0;
  type_conflict local_8;
  
  local_8 = (type_conflict)value_create_array(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  if (local_8 == (type_conflict)0x0) {
    local_8 = (type_conflict)0x0;
  }
  else {
    ppvVar1 = value_to_array((value)0x106a8c);
    pvVar2 = value_create_string((char *)ppvVar1,in_stack_ffffffffffffffd8);
    *ppvVar1 = pvVar2;
    if (*ppvVar1 == (value)0x0) {
      value_type_destroy(in_stack_00000050);
      local_8 = (type_conflict)0x0;
    }
    else {
      pvVar2 = value_create_map(ppvVar1,in_stack_ffffffffffffffd8);
      ppvVar1[1] = pvVar2;
      if (ppvVar1[1] == (value)0x0) {
        value_type_destroy(in_stack_00000050);
        local_8 = (type_conflict)0x0;
      }
      else {
        ppvVar1 = value_to_map((value)0x106b19);
        pvVar2 = type_metadata(local_8);
        *ppvVar1 = pvVar2;
        if (*ppvVar1 == (value)0x0) {
          value_type_destroy(in_stack_00000050);
          local_8 = (type_conflict)0x0;
        }
      }
    }
  }
  return local_8;
}

Assistant:

value signature_metadata_return(signature s)
{
	static const char ret_str[] = "ret";

	value ret = value_create_array(NULL, 2);

	value *ret_array, *ret_map;

	if (ret == NULL)
	{
		return NULL;
	}

	ret_array = value_to_array(ret);

	ret_array[0] = value_create_string(ret_str, sizeof(ret_str) - 1);

	if (ret_array[0] == NULL)
	{
		value_type_destroy(ret);

		return NULL;
	}

	ret_array[1] = value_create_map(NULL, 1);

	if (ret_array[1] == NULL)
	{
		value_type_destroy(ret);

		return NULL;
	}

	ret_map = value_to_map(ret_array[1]);

	ret_map[0] = type_metadata(s->ret);

	if (ret_map[0] == NULL)
	{
		value_type_destroy(ret);

		return NULL;
	}

	return ret;
}